

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearbox.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsGearbox::ConstraintsLoadJacobians(ChShaftsGearbox *this)

{
  ChConstraintThreeGeneric *this_00;
  double dVar1;
  ChRowVectorRef local_50;
  double local_30;
  double local_28;
  double local_20;
  
  dVar1 = this->r1;
  this_00 = &this->constraint;
  ChConstraintThreeGeneric::Get_Cq_a(&local_50,this_00);
  if (0 < local_50.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_cols.m_value) {
    *local_50.
     super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
     .
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
     .m_data = dVar1;
    dVar1 = this->r2;
    ChConstraintThreeGeneric::Get_Cq_b(&local_50,this_00);
    if (0 < local_50.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_cols.m_value) {
      *local_50.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_data = dVar1;
      dVar1 = (this->shaft_dir).m_data[0];
      local_20 = (this->shaft_dir).m_data[1];
      local_28 = (this->shaft_dir).m_data[2];
      ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
      if (0 < local_50.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_cols.m_value) {
        *local_50.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
         .m_data = 0.0;
        ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
        if (1 < local_50.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_cols.m_value) {
          local_50.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data[1] = 0.0;
          ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
          if (2 < local_50.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_cols.m_value) {
            local_50.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data[2] = 0.0;
            local_30 = this->r3;
            ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
            if (3 < local_50.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                    .m_cols.m_value) {
              local_50.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data[3] = local_30 * dVar1;
              dVar1 = this->r3;
              ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
              if (4 < local_50.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                      .m_cols.m_value) {
                local_50.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data[4] = dVar1 * local_20;
                dVar1 = this->r3;
                ChConstraintThreeGeneric::Get_Cq_c(&local_50,this_00);
                if (5 < local_50.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                        .
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                        .
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                        .m_cols.m_value) {
                  local_50.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data[5] = dVar1 * local_28;
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsGearbox::ConstraintsLoadJacobians() {
    // compute jacobians
    constraint.Get_Cq_a()(0) = r1;
    constraint.Get_Cq_b()(0) = r2;

    // ChVector<> jacw = body->TransformDirectionParentToLocal(shaft_dir);
    ChVector<> jacw = shaft_dir;

    constraint.Get_Cq_c()(0) = 0;
    constraint.Get_Cq_c()(1) = 0;
    constraint.Get_Cq_c()(2) = 0;
    constraint.Get_Cq_c()(3) = jacw.x() * r3;
    constraint.Get_Cq_c()(4) = jacw.y() * r3;
    constraint.Get_Cq_c()(5) = jacw.z() * r3;
}